

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
kainjow::mustache::split<std::__cxx11::wstring>
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,mustache *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s,
          value_type delim)

{
  wistream *pwVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> item;
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&ss,(wstring *)this,_S_out|_S_in);
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = L'\0';
  while( true ) {
    pwVar1 = std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                       ((wistream *)&ss,(wstring *)&item,(wchar_t)s);
    if (((byte)pwVar1[*(long *)(*(long *)pwVar1 + -0x18) + 0x20] & 5) != 0) break;
    Catch::clara::std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back(__return_storage_ptr__,&item);
  }
  std::__cxx11::wstring::~wstring((wstring *)&item);
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::vector<string_type> split(const string_type& s, typename string_type::value_type delim) {
    std::vector<string_type> elems;
    std::basic_stringstream<typename string_type::value_type> ss(s);
    string_type item;
    while (std::getline(ss, item, delim)) {
        elems.push_back(item);
    }
    return elems;
}